

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

bool __thiscall CCheckQueue<CScriptCheck>::Loop(CCheckQueue<CScriptCheck> *this,bool fMaster)

{
  uint *puVar1;
  long lVar2;
  pointer pCVar3;
  pointer pCVar4;
  bool bVar5;
  pointer pFVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  CScriptCheck *check;
  CScriptCheck *this_00;
  undefined7 in_register_00000031;
  unique_lock *puVar10;
  long in_FS_OFFSET;
  uint local_84;
  ulong local_80;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar10 = (unique_lock *)&this->m_worker_cv;
  if ((int)CONCAT71(in_register_00000031,fMaster) != 0) {
    puVar10 = (unique_lock *)&this->m_master_cv;
  }
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::reserve
            ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&vChecks,(ulong)this->nBatchSize
            );
  local_80 = 0;
  bVar7 = 1;
  local_84 = (uint)&this->queue;
  do {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&lock.super_unique_lock,&this->m_mutex,
               "m_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/checkqueue.h"
               ,0x4b,false);
    if ((int)local_80 == 0) {
      this->nTotal = this->nTotal + 1;
    }
    else {
      this->fAllOk = (bool)(this->fAllOk & bVar7);
      puVar1 = &this->nTodo;
      *puVar1 = *puVar1 - (int)local_80;
      if (*puVar1 == 0 && !fMaster) {
        std::condition_variable::notify_one();
      }
    }
    while( true ) {
      pCVar3 = (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
               .super__Vector_impl_data._M_start;
      pCVar4 = (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pCVar3 != pCVar4) break;
      if ((this->m_request_stop & 1U) != 0) goto LAB_0053da6f;
      if ((fMaster) && (this->nTodo == 0)) {
        this->nTotal = this->nTotal + -1;
        local_84 = (uint)this->fAllOk;
        this->fAllOk = true;
        bVar5 = false;
        goto LAB_0053db1c;
      }
      this->nIdle = this->nIdle + 1;
      std::condition_variable::wait(puVar10);
      this->nIdle = this->nIdle + -1;
    }
    if ((this->m_request_stop & 1U) == 0) {
      uVar8 = (uint)((((long)pCVar4 - (long)pCVar3) / 0x50 & 0xffffffffU) /
                    (ulong)(this->nTotal + this->nIdle + 1));
      uVar9 = this->nBatchSize;
      if (uVar8 < this->nBatchSize) {
        uVar9 = uVar8;
      }
      local_80 = (ulong)(uVar9 + (uVar9 == 0));
      std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
      _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>>>
                ((vector<CScriptCheck,std::allocator<CScriptCheck>> *)&vChecks,pCVar4 + -local_80,
                 pCVar4);
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::erase
                (&this->queue,pCVar4 + -local_80,
                 (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      bVar7 = this->fAllOk;
      bVar5 = true;
    }
    else {
LAB_0053da6f:
      bVar5 = false;
      local_84 = 0;
    }
LAB_0053db1c:
    std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
    pFVar6 = vChecks.
             super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = (CScriptCheck *)
              vChecks.
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar5) {
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
                ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&vChecks);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return (bool)((byte)local_84 & 1);
    }
    for (; this_00 != (CScriptCheck *)pFVar6; this_00 = this_00 + 1) {
      if ((bVar7 & 1) != 0) {
        bVar7 = CScriptCheck::operator()(this_00);
      }
    }
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::clear
              ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&vChecks);
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }